

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutList.h
# Opt level: O0

Cut_Cut_t * Cut_ListFinish(Cut_List_t *p)

{
  int local_24;
  Cut_Cut_t ***pppCStack_20;
  int i;
  Cut_Cut_t **ppTail;
  Cut_Cut_t *pHead;
  Cut_List_t *p_local;
  
  ppTail = (Cut_Cut_t **)0x0;
  pppCStack_20 = &ppTail;
  pHead = (Cut_Cut_t *)p;
  for (local_24 = 1; local_24 < 0xd; local_24 = local_24 + 1) {
    if (*(long *)(&pHead->field_0x0 + (long)local_24 * 8) != 0) {
      *pppCStack_20 = *(Cut_Cut_t ***)(&pHead->field_0x0 + (long)local_24 * 8);
      pppCStack_20 = *(Cut_Cut_t ****)(&pHead[4].uCanon0 + (long)local_24 * 2);
    }
  }
  *pppCStack_20 = (Cut_Cut_t **)0x0;
  return (Cut_Cut_t *)ppTail;
}

Assistant:

static inline Cut_Cut_t * Cut_ListFinish( Cut_List_t * p )
{
    Cut_Cut_t * pHead = NULL, ** ppTail = &pHead;
    int i;
    for ( i = 1; i <= CUT_SIZE_MAX; i++ )
    {
        if ( p->pHead[i] == NULL )
            continue;
        *ppTail = p->pHead[i];
        ppTail = p->ppTail[i];
    }
    *ppTail = NULL;
    return pHead;
}